

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Platform.cpp
# Opt level: O1

unsigned_short
gr::MultiByteToWideChar
          (unsigned_long code_page,unsigned_long param_2,char *source,size_t src_count,
          unsigned_short *dest,size_t dst_count)

{
  size_t sVar1;
  iconv_t __cd;
  ostream *poVar2;
  int *piVar3;
  char *pcVar4;
  unsigned_short uVar5;
  char *dst_ptr;
  __string_type fromcode;
  char *src_ptr;
  ostringstream oss;
  size_t local_1f0;
  size_t local_1e8;
  unsigned_short *local_1e0;
  long local_1d8;
  long *local_1c0;
  long local_1b0 [2];
  char *local_1a0;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  if (dest == (unsigned_short *)0x0) {
    uVar5 = 0;
  }
  else {
    local_1f0 = src_count;
    local_1e8 = dst_count;
    if (src_count == 0xffffffffffffffff) {
      local_1f0 = strlen(source);
    }
    if (dst_count == 0) {
      uVar5 = (short)local_1f0 * 3;
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_198);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"CP",2);
      std::ostream::_M_insert<unsigned_long>((ulong)local_198);
      std::__cxx11::stringbuf::str();
      __cd = iconv_open("UCS-2LE",(char *)local_1c0);
      if (__cd == (iconv_t)0xffffffffffffffff) {
        poVar2 = std::operator<<((ostream *)&std::cerr,program_invocation_short_name);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,": iconv_open(\"",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"UCS-2LE",7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\", \"",4);
        std::__cxx11::stringbuf::str();
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,(char *)local_1e0,local_1d8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"): ",4);
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        poVar2 = std::operator<<(poVar2,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar2);
        std::__cxx11::string::~string((string *)&local_1e0);
        exit(1);
      }
      sVar1 = local_1e8 * 2;
      local_1e8 = sVar1;
      local_1e0 = dest;
      local_1a0 = source;
      iconv(__cd,&local_1a0,&local_1f0,(char **)&local_1e0,&local_1e8);
      iconv_close(__cd);
      uVar5 = (short)sVar1 - (short)local_1e8;
      if (local_1c0 != local_1b0) {
        operator_delete(local_1c0,local_1b0[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream(local_198);
      std::ios_base::~ios_base(local_128);
    }
  }
  return uVar5;
}

Assistant:

unsigned short MultiByteToWideChar(unsigned long code_page, unsigned long, 
        const char * source, size_t src_count, 
        unsigned short * dest, size_t dst_count)
{
    if (!dest)	// An error condition is indicated by 0
        return 0;

    if (src_count == size_t(-1))     // When passed -1 it should find the 
	src_count = strlen(source);  // length of the source it's self

    if (dst_count == 0)		// We cannot find the completed size so esitmate it.
	return src_count*3;

    std::ostringstream oss; oss << "CP" << code_page;
    auto const fromcode = oss.str();

#if WORDS_BIGENDIAN
    auto const tocode = "UCS-2BE";
#else
    auto const tocode = "UCS-2LE";
#endif
    iconv_t cdesc = iconv_open(tocode, fromcode.c_str());
   
    if (cdesc == iconv_t(-1))
    {
	std::cerr << program_invocation_short_name
                  << ": iconv_open(\"" << tocode << "\", \"" << oss.str() << "\"): "
                  << strerror(errno) << std::endl;
	exit(1);
    }

    char *dst_ptr = reinterpret_cast<char *>(dest);
    char *src_ptr = const_cast<char *>(source);
    dst_count *= sizeof(unsigned short);    
    const size_t dst_size = dst_count;

    iconv(cdesc, &src_ptr, &src_count, &dst_ptr, &dst_count);
    iconv_close(cdesc);
    
    return dst_size - dst_count;
}